

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bpp2.c
# Opt level: O2

void ssh2_bpp_format_packet_inner(ssh2_bpp_state *s,PktOut *pkt)

{
  size_t sVar1;
  uchar *puVar2;
  PacketLogSettings *pPVar3;
  LogContext *ctx;
  ssh_cipher *psVar4;
  ssh_compressor *psVar5;
  int iVar6;
  uint8_t *p;
  char *texttype;
  ulong uVar7;
  uint uVar8;
  ulong uVar9;
  ssh2_mac *psVar10;
  int iVar11;
  int iVar12;
  uint uVar13;
  size_t len;
  bool bVar14;
  ptrlen pkt_00;
  size_t local_78;
  int newlen;
  logblank_t blanks [4];
  
  if ((s->bpp).logctx != (LogContext *)0x0) {
    sVar1 = pkt->prefix;
    puVar2 = pkt->data;
    len = pkt->length - sVar1;
    pkt_00.len = len;
    pkt_00.ptr = puVar2 + sVar1;
    iVar6 = ssh2_censor_packet((s->bpp).pls,pkt->type,true,pkt_00,blanks);
    pPVar3 = (s->bpp).pls;
    ctx = (s->bpp).logctx;
    iVar11 = pkt->type;
    texttype = ssh2_pkt_type(pPVar3->kctx,pPVar3->actx,iVar11);
    log_packet(ctx,1,iVar11,texttype,puVar2 + sVar1,len,iVar6,blanks,&(s->out).sequence,
               pkt->downstream_id,pkt->additional_log_text);
  }
  psVar4 = (s->out).cipher;
  uVar13 = 8;
  if (psVar4 != (ssh_cipher *)0x0) {
    uVar13 = psVar4->vt->blksize;
  }
  uVar8 = 8;
  if (8 < (int)uVar13) {
    uVar8 = uVar13;
  }
  psVar5 = s->out_comp;
  if (psVar5 != (ssh_compressor *)0x0) {
    iVar11 = (int)pkt->minlen;
    if (iVar11 == 0) {
      iVar11 = 0;
    }
    else {
      psVar10 = (s->out).mac;
      if (psVar10 != (ssh2_mac *)0x0) {
        iVar11 = iVar11 - psVar10->vt->len;
      }
      iVar11 = iVar11 + -8;
    }
    (*psVar5->vt->compress)
              (psVar5,pkt->data + 5,(int)pkt->length + -5,(uchar **)blanks,&newlen,iVar11);
    pkt->length = 5;
    BinarySink_put_data(pkt->binarysink_,(void *)blanks[0]._0_8_,(long)newlen);
    safefree((void *)blanks[0]._0_8_);
  }
  psVar10 = (s->out).mac;
  if (psVar10 == (ssh2_mac *)0x0) {
    uVar7 = 4;
  }
  else {
    uVar7 = (ulong)(((s->out).etm_mode ^ 1) << 2);
  }
  uVar9 = (ulong)uVar8;
  sVar1 = pkt->length;
  iVar11 = (int)((uVar9 - (uVar7 + sVar1) % uVar9) % uVar9);
  iVar6 = iVar11 + 4;
  if (0xff < iVar6) {
    __assert_fail("padding <= 255",
                  "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/ssh/bpp2.c",
                  0x318,"void ssh2_bpp_format_packet_inner(struct ssh2_bpp_state *, PktOut *)");
  }
  if (psVar10 == (ssh2_mac *)0x0) {
    local_78 = 0;
  }
  else {
    local_78 = (size_t)psVar10->vt->len;
  }
  iVar12 = 0;
  if (0 < iVar6) {
    iVar12 = iVar6;
  }
  while (bVar14 = iVar12 != 0, iVar12 = iVar12 + -1, bVar14) {
    BinarySink_put_byte(pkt->binarysink_,'\0');
  }
  iVar12 = (int)sVar1;
  random_read(pkt->data + iVar12,(long)iVar6);
  pkt->data[4] = (uchar)iVar6;
  uVar13 = iVar11 + iVar12;
  *(uint *)pkt->data =
       uVar13 >> 0x18 | (uVar13 & 0xff0000) >> 8 | (uVar13 & 0xff00) << 8 | uVar13 * 0x1000000;
  psVar4 = (s->out).cipher;
  if ((psVar4 != (ssh_cipher *)0x0) && ((psVar4->vt->flags & 2) != 0)) {
    (*psVar4->vt->encrypt_length)(psVar4,pkt->data,4,(s->out).sequence);
  }
  iVar6 = iVar6 + iVar12;
  BinarySink_put_padding(pkt->binarysink_,local_78,'\0');
  psVar10 = (s->out).mac;
  if (psVar10 != (ssh2_mac *)0x0) {
    if ((s->out).etm_mode == true) {
      psVar4 = (s->out).cipher;
      if (psVar4 != (ssh_cipher *)0x0) {
        (*psVar4->vt->encrypt)(psVar4,pkt->data + 4,uVar13);
        psVar10 = (s->out).mac;
      }
      ssh2_mac_generate(psVar10,pkt->data,iVar6,(s->out).sequence);
      goto LAB_0011cf65;
    }
    ssh2_mac_generate(psVar10,pkt->data,iVar6,(s->out).sequence);
  }
  psVar4 = (s->out).cipher;
  if (psVar4 != (ssh_cipher *)0x0) {
    (*psVar4->vt->encrypt)(psVar4,pkt->data,iVar6);
  }
LAB_0011cf65:
  (s->out).sequence = (s->out).sequence + 1;
  dts_consume(&s->stats->out,(long)iVar6);
  return;
}

Assistant:

static void ssh2_bpp_format_packet_inner(struct ssh2_bpp_state *s, PktOut *pkt)
{
    int origlen, cipherblk, maclen, padding, unencrypted_prefix, i;

    if (s->bpp.logctx) {
        ptrlen pktdata = make_ptrlen(pkt->data + pkt->prefix,
                                     pkt->length - pkt->prefix);
        logblank_t blanks[MAX_BLANKS];
        int nblanks = ssh2_censor_packet(
            s->bpp.pls, pkt->type, true, pktdata, blanks);
        log_packet(s->bpp.logctx, PKT_OUTGOING, pkt->type,
                   ssh2_pkt_type(s->bpp.pls->kctx, s->bpp.pls->actx,
                                 pkt->type),
                   pktdata.ptr, pktdata.len, nblanks, blanks, &s->out.sequence,
                   pkt->downstream_id, pkt->additional_log_text);
    }

    cipherblk = s->out.cipher ? ssh_cipher_alg(s->out.cipher)->blksize : 8;
    cipherblk = cipherblk < 8 ? 8 : cipherblk;  /* or 8 if blksize < 8 */

    if (s->out_comp) {
        unsigned char *newpayload;
        int minlen, newlen;

        /*
         * Compress packet payload.
         */
        minlen = pkt->minlen;
        if (minlen) {
            /*
             * Work out how much compressed data we need (at least) to
             * make the overall packet length come to pkt->minlen.
             */
            if (s->out.mac)
                minlen -= ssh2_mac_alg(s->out.mac)->len;
            minlen -= 8;              /* length field + min padding */
        }

        ssh_compressor_compress(s->out_comp, pkt->data + 5, pkt->length - 5,
                                &newpayload, &newlen, minlen);
        pkt->length = 5;
        put_data(pkt, newpayload, newlen);
        sfree(newpayload);
    }

    /*
     * Add padding. At least four bytes, and must also bring total
     * length (minus MAC) up to a multiple of the block size.
     * If pkt->forcepad is set, make sure the packet is at least that size
     * after padding.
     */
    padding = 4;
    unencrypted_prefix = (s->out.mac && s->out.etm_mode) ? 4 : 0;
    padding +=
        (cipherblk - (pkt->length - unencrypted_prefix + padding) % cipherblk)
        % cipherblk;
    assert(padding <= 255);
    maclen = s->out.mac ? ssh2_mac_alg(s->out.mac)->len : 0;
    origlen = pkt->length;
    for (i = 0; i < padding; i++)
        put_byte(pkt, 0);              /* make space for random padding */
    random_read(pkt->data + origlen, padding);
    pkt->data[4] = padding;
    PUT_32BIT_MSB_FIRST(pkt->data, origlen + padding - 4);

    /* Encrypt length if the scheme requires it */
    if (s->out.cipher &&
        (ssh_cipher_alg(s->out.cipher)->flags & SSH_CIPHER_SEPARATE_LENGTH)) {
        ssh_cipher_encrypt_length(s->out.cipher, pkt->data, 4,
                                  s->out.sequence);
    }

    put_padding(pkt, maclen, 0);

    if (s->out.mac && s->out.etm_mode) {
        /*
         * OpenSSH-defined encrypt-then-MAC protocol.
         */
        if (s->out.cipher)
            ssh_cipher_encrypt(s->out.cipher,
                               pkt->data + 4, origlen + padding - 4);
        ssh2_mac_generate(s->out.mac, pkt->data, origlen + padding,
                          s->out.sequence);
    } else {
        /*
         * SSH-2 standard protocol.
         */
        if (s->out.mac)
            ssh2_mac_generate(s->out.mac, pkt->data, origlen + padding,
                              s->out.sequence);
        if (s->out.cipher)
            ssh_cipher_encrypt(s->out.cipher, pkt->data, origlen + padding);
    }

    s->out.sequence++;       /* whether or not we MACed */

    dts_consume(&s->stats->out, origlen + padding);
}